

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsprg.cpp
# Opt level: O0

CTcSymObj * __thiscall
CTcParser::find_or_def_gramprod(CTcParser *this,char *txt,size_t len,CTcGramProdEntry **entryp)

{
  tctarg_obj_id_t tVar1;
  tc_symtype_t tVar2;
  tc_metaclass_t tVar3;
  CTcToken *this_00;
  char *len_00;
  CTcToken *this_01;
  CTcParser *this_02;
  undefined8 *in_RCX;
  ulong in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  CTcGramProdEntry *entry;
  CTcSymObj *sym;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  CTcParser *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  CTcParser *in_stack_ffffffffffffff90;
  tc_metaclass_t in_stack_ffffffffffffffc0;
  CTcDictEntry *in_stack_ffffffffffffffc8;
  undefined8 local_30;
  undefined8 local_28;
  
  local_28 = (CTcSymObjBase *)
             CTcPrsSymtab::find((CTcPrsSymtab *)in_stack_ffffffffffffff80,
                                (textchar_t *)
                                CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                                0x21abe1);
  if (local_28 == (CTcSymObjBase *)0x0) {
    local_28 = (CTcSymObjBase *)CTcSymbolBase::operator_new(0x21abfc);
    this_00 = CTcTokenizer::getcur(G_tok);
    len_00 = CTcToken::get_text(this_00);
    this_01 = CTcTokenizer::getcur(G_tok);
    this_02 = (CTcParser *)CTcToken::get_text_len(this_01);
    tVar1 = CTcGenTarg::new_obj_id(G_cg);
    CTcSymObj::CTcSymObj
              ((CTcSymObj *)this_00,(char *)local_28,(size_t)len_00,(int)((ulong)this_01 >> 0x20),
               (vm_obj_id_t)this_01,(int)((ulong)this_02 >> 0x20),in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffc8);
    (**(code **)(**(long **)(in_RDI + 0x80) + 0x18))(*(long **)(in_RDI + 0x80),local_28);
    local_30 = create_gramprod_entry(this_02,(CTcSymObj *)CONCAT44(tVar1,in_stack_ffffffffffffff88))
    ;
  }
  else {
    tVar2 = CTcSymbolBase::get_type((CTcSymbolBase *)local_28);
    if (tVar2 == TC_SYM_OBJ) {
      tVar3 = CTcSymObjBase::get_metaclass(local_28);
      if (tVar3 != TC_META_GRAMPROD) {
        CTcTokenizer::log_error(0x2b87,in_RDX & 0xffffffff,in_RSI);
        local_28 = (CTcSymObjBase *)0x0;
      }
    }
    else {
      CTcTokenizer::log_error(0x2b60,in_RDX & 0xffffffff,in_RSI);
      local_28 = (CTcSymObjBase *)0x0;
    }
    if (local_28 != (CTcSymObjBase *)0x0) {
      CTcSymObjBase::set_extern(local_28,0);
    }
    local_30 = get_gramprod_entry(in_stack_ffffffffffffff80,
                                  (CTcSymObj *)
                                  CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (local_30 == (CTcGramProdEntry *)0x0) {
      local_30 = create_gramprod_entry
                           (in_stack_ffffffffffffff90,
                            (CTcSymObj *)
                            CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    }
  }
  if (in_RCX != (undefined8 *)0x0) {
    *in_RCX = local_30;
  }
  return (CTcSymObj *)local_28;
}

Assistant:

CTcSymObj *CTcParser::find_or_def_gramprod(const char *txt, size_t len,
                                           CTcGramProdEntry **entryp)
{
    CTcSymObj *sym;
    CTcGramProdEntry *entry;

    /* look up the symbol */
    sym = (CTcSymObj *)global_symtab_->find(txt, len);

    /* if it's not defined, add it; otherwise, make sure it's correct */
    if (sym == 0)
    {
        /* it's not yet defined - define it as a grammar production */
        sym = new CTcSymObj(G_tok->getcur()->get_text(),
                            G_tok->getcur()->get_text_len(),
                            FALSE, G_cg->new_obj_id(), FALSE,
                            TC_META_GRAMPROD, 0);

        /* add it to the global symbol table */
        global_symtab_->add_entry(sym);

        /* create a new production list entry */
        entry = create_gramprod_entry(sym);
    }
    else
    {
        /* make sure it's an object of metaclass 'grammar production' */
        if (sym->get_type() != TC_SYM_OBJ)
        {
            /* log an error */
            G_tok->log_error(TCERR_REDEF_AS_OBJ, (int)len, txt);

            /* forget the symbol - it's not even an object */
            sym = 0;
        }
        else if (sym->get_metaclass() != TC_META_GRAMPROD)
        {
            /* it's an object, but not a production - log an error */
            G_tok->log_error(TCERR_REDEF_AS_GRAMPROD, (int)len, txt);

            /* forget the symbol */
            sym = 0;
        }

        /* 
         *   If we found the symbol, make sure it's not marked as external,
         *   since we're actually defining a rule for this production.  If
         *   the production is exported from any other modules, we'll share
         *   the production object with the other modules.  
         */
        if (sym != 0)
            sym->set_extern(FALSE);

        /* get the existing production object, if any */
        entry = get_gramprod_entry(sym);

        /* 
         *   if we didn't find the entry, we must have loaded the symbol from
         *   a symbol file - add the entry now 
         */
        if (entry == 0)
            entry = create_gramprod_entry(sym);
    }

    /* 
     *   if the caller is interested in knowing the associated grammar rule
     *   list entry, return it 
     */
    if (entryp != 0)
        *entryp = entry;

    /* return the new symbol */
    return sym;
}